

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

ssize_t __thiscall r_code::SysObject::write(SysObject *this,int __fd,void *__buf,size_t __n)

{
  pointer pAVar1;
  Atom *pAVar2;
  uint *puVar3;
  ulong uVar4;
  SysView **ppSVar5;
  size_t sVar6;
  pointer pAVar7;
  uint32_t *puVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  long lVar10;
  
  puVar8 = (uint32_t *)CONCAT44(in_register_00000034,__fd);
  *puVar8 = this->oid;
  pAVar7 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar1 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8[1] = (uint32_t)((ulong)((long)pAVar1 - (long)pAVar7) >> 2);
  puVar8[2] = (uint32_t)
              ((ulong)((long)(this->super_ImageObject).references.m_vector.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->super_ImageObject).references.m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
  puVar8[3] = (uint32_t)
              ((ulong)((long)(this->markers).m_vector.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->markers).m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
  puVar8[4] = (uint32_t)
              ((ulong)((long)(this->views).m_vector.
                             super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->views).m_vector.
                            super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
  puVar8 = puVar8 + 5;
  for (uVar9 = 0; uVar9 < (ulong)((long)pAVar1 - (long)pAVar7 >> 2); uVar9 = uVar9 + 1) {
    pAVar2 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,uVar9);
    *puVar8 = pAVar2->atom;
    pAVar7 = (this->super_ImageObject).code.m_vector.
             super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar1 = (this->super_ImageObject).code.m_vector.
             super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar8 = puVar8 + 1;
  }
  for (uVar9 = 0;
      uVar9 < (ulong)((long)(this->super_ImageObject).references.m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->super_ImageObject).references.m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar9 = uVar9 + 1) {
    puVar3 = vector<unsigned_int>::operator[](&(this->super_ImageObject).references,uVar9);
    *puVar8 = *puVar3;
    puVar8 = puVar8 + 1;
  }
  for (uVar9 = 0;
      uVar9 < (ulong)((long)(this->markers).m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->markers).m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar9 = uVar9 + 1) {
    puVar3 = vector<unsigned_int>::operator[](&this->markers,uVar9);
    *puVar8 = *puVar3;
    puVar8 = puVar8 + 1;
  }
  lVar10 = 0;
  for (uVar9 = 0;
      uVar4 = (long)(this->views).m_vector.
                    super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->views).m_vector.
                    super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3, uVar9 < uVar4; uVar9 = uVar9 + 1)
  {
    ppSVar5 = vector<r_code::SysView_*>::operator[](&this->views,uVar9);
    (*((*ppSVar5)->super_ImageObject)._vptr_ImageObject[2])(*ppSVar5,puVar8 + lVar10);
    ppSVar5 = vector<r_code::SysView_*>::operator[](&this->views,uVar9);
    sVar6 = SysView::get_size(*ppSVar5);
    lVar10 = lVar10 + sVar6;
  }
  return uVar4;
}

Assistant:

void SysObject::write(uint32_t *data)
{
    data[0] = oid;
    data[1] = code.size();
    data[2] = references.size();
    data[3] = markers.size();
    data[4] = views.size();
    size_t i;
    size_t j;
    size_t k;
    size_t l;

    for (i = 0; i < code.size(); ++i) {
        data[5 + i] = code[i].atom;
    }

    for (j = 0; j < references.size(); ++j) {
        data[5 + i + j] = references[j];
    }

    for (k = 0; k < markers.size(); ++k) {
        data[5 + i + j + k] = markers[k];
    }

    size_t offset = 0;

    for (l = 0; l < views.size(); ++l) {
        views[l]->write(data + 5 + i + j + k + offset);
        offset += views[l]->get_size();
    }
}